

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xss.cpp
# Opt level: O3

void __thiscall cppcms::xss::rules::rules(rules *this,rules *other)

{
  data *pdVar1;
  data *this_00;
  
  this_00 = (data *)operator_new(0xf8);
  data::data(this_00);
  (this->d).ptr_ = this_00;
  pdVar1 = (other->d).ptr_;
  (other->d).ptr_ = this_00;
  (this->d).ptr_ = pdVar1;
  return;
}

Assistant:

rules::rules(rules &&other) : d(new data())
	{
		d.swap(other.d);
	}